

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O1

void decaf_448_point_mul_by_ratio_and_encode_like_eddsa(uint8_t *enc,decaf_448_point_s *p)

{
  mask_t mVar1;
  gf_448_t u;
  decaf_448_point_t q;
  gf_448_t t;
  gf_448_t z;
  gf_448_t y;
  gf_448_t x;
  gf_448_s local_2a0;
  gf_448_s local_260;
  gf_448_s local_220;
  gf_448_s local_1e0 [2];
  gf_448_s local_160;
  gf_448_s local_120;
  gf_448_s local_e0;
  gf_448_s local_a0;
  
  memcpy(&local_260,p,0x100);
  gf_448_sqr(&local_a0,&local_260);
  gf_448_sqr(&local_160,&local_220);
  gf_448_add(&local_2a0,&local_a0,&local_160);
  gf_448_add(&local_120,&local_220,&local_260);
  gf_448_sqr(&local_e0,&local_120);
  gf_448_sub(&local_e0,&local_e0,&local_2a0);
  gf_448_sub(&local_120,&local_160,&local_a0);
  gf_448_sqr(&local_a0,local_1e0);
  gf_448_add(&local_160,&local_a0,&local_a0);
  gf_448_sub(&local_160,&local_160,&local_120);
  gf_448_mul(&local_a0,&local_160,&local_e0);
  gf_448_mul(&local_e0,&local_120,&local_2a0);
  gf_448_mul(&local_120,&local_2a0,&local_160);
  decaf_bzero(&local_2a0,0x40);
  gf_invert(&local_120,&local_120,1);
  gf_448_mul(&local_160,&local_a0,&local_120);
  gf_448_mul(&local_a0,&local_e0,&local_120);
  enc[0x38] = '\0';
  gf_448_serialize(enc,&local_a0);
  mVar1 = gf_448_lobit(&local_160);
  enc[0x38] = enc[0x38] | (byte)mVar1 & 0x80;
  decaf_bzero(&local_a0,0x40);
  decaf_bzero(&local_e0,0x40);
  decaf_bzero(&local_120,0x40);
  decaf_bzero(&local_160,0x40);
  decaf_bzero(&local_260,0x100);
  return;
}

Assistant:

void API_NS(point_mul_by_ratio_and_encode_like_eddsa) (
    uint8_t enc[DECAF_EDDSA_448_PUBLIC_BYTES],
    const point_t p
) {
    
    /* The point is now on the twisted curve.  Move it to untwisted. */
    gf x, y, z, t;
    point_t q;
#if COFACTOR == 8
    API_NS(point_double)(q,p);
#else
    API_NS(point_copy)(q,p);
#endif
    
#if EDDSA_USE_SIGMA_ISOGENY
    {
        /* Use 4-isogeny like ed25519:
         *   2*x*y*sqrt(d/a-1)/(ax^2 + y^2 - 2)
         *   (y^2 - ax^2)/(y^2 + ax^2)
         * with a = -1, d = -EDWARDS_D:
         *   -2xysqrt(EDWARDS_D-1)/(2z^2-y^2+x^2)
         *   (y^2+x^2)/(y^2-x^2)
         */
        gf u;
        gf_sqr ( x, q->x ); // x^2
        gf_sqr ( t, q->y ); // y^2
        gf_add( u, x, t ); // x^2 + y^2
        gf_add( z, q->y, q->x );
        gf_sqr ( y, z);
        gf_sub ( y, u, y ); // -2xy
        gf_sub ( z, t, x ); // y^2 - x^2
        gf_sqr ( x, q->z );
        gf_add ( t, x, x);
        gf_sub ( t, t, z);  // 2z^2 - y^2 + x^2
        gf_mul ( x, y, z ); // 2xy(y^2-x^2)
        gf_mul ( y, u, t ); // (x^2+y^2)(2z^2-y^2+x^2)
        gf_mul ( u, z, t );
        gf_copy( z, u );
        gf_mul ( u, x, RISTRETTO_FACTOR );
#if IMAGINE_TWIST
        gf_mul_i( x, u );
#else
#error "... probably wrong"
        gf_copy( x, u );
#endif
        decaf_bzero(u,sizeof(u));
    }
#elif IMAGINE_TWIST
    {
        API_NS(point_double)(q,q);
        API_NS(point_double)(q,q);
        gf_mul_i(x, q->x);
        gf_copy(y, q->y);
        gf_copy(z, q->z);
    }
#else
    {
        /* 4-isogeny: 2xy/(y^+x^2), (y^2-x^2)/(2z^2-y^2+x^2) */
        gf u;
        gf_sqr ( x, q->x );
        gf_sqr ( t, q->y );
        gf_add( u, x, t );
        gf_add( z, q->y, q->x );
        gf_sqr ( y, z);
        gf_sub ( y, y, u );
        gf_sub ( z, t, x );
        gf_sqr ( x, q->z );
        gf_add ( t, x, x); 
        gf_sub ( t, t, z);
        gf_mul ( x, t, y );
        gf_mul ( y, z, u );
        gf_mul ( z, u, t );
        decaf_bzero(u,sizeof(u));
    }
#endif
    /* Affinize */
    gf_invert(z,z,1);
    gf_mul(t,x,z);
    gf_mul(x,y,z);
    
    /* Encode */
    enc[DECAF_EDDSA_448_PRIVATE_BYTES-1] = 0;
    gf_serialize(enc, x);
    enc[DECAF_EDDSA_448_PRIVATE_BYTES-1] |= 0x80 & gf_lobit(t);

    decaf_bzero(x,sizeof(x));
    decaf_bzero(y,sizeof(y));
    decaf_bzero(z,sizeof(z));
    decaf_bzero(t,sizeof(t));
    API_NS(point_destroy)(q);
}